

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Al.cpp
# Opt level: O1

void Al::Initialize(int *argc,char ***argv,MPI_Comm world_comm)

{
  int iVar1;
  ProgressEngine *this;
  char *__s;
  size_t sVar2;
  int *sig;
  int *piVar3;
  bool bVar4;
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> handled_signals;
  allocator_type local_71;
  vector<int,_std::allocator<int>_> local_70;
  long *local_58 [2];
  long local_48 [2];
  undefined8 local_38;
  undefined8 uStack_30;
  undefined4 local_28;
  
  if ((anonymous_namespace)::is_initialized == '\0') {
    internal::mpi::init((EVP_PKEY_CTX *)argc);
    this = (ProgressEngine *)operator_new(0x8100,0x80);
    internal::ProgressEngine::ProgressEngine(this);
    (anonymous_namespace)::is_initialized = '\x01';
    (anonymous_namespace)::progress_engine = this;
    __s = getenv("AL_DISABLE_SIGNAL_HANDLER");
    if (__s == (char *)0x0) {
      bVar4 = true;
    }
    else {
      local_58[0] = local_48;
      sVar2 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_58,__s,__s + sVar2);
      iVar1 = std::__cxx11::string::compare((char *)local_58);
      bVar4 = iVar1 == 0;
      if (local_58[0] != local_48) {
        operator_delete(local_58[0],local_48[0] + 1);
      }
    }
    if (bVar4) {
      local_38 = 0x600000004;
      uStack_30 = 0x700000008;
      local_28 = 0xb;
      __l._M_len = 5;
      __l._M_array = (iterator)&local_38;
      std::vector<int,_std::allocator<int>_>::vector(&local_70,__l,&local_71);
      Initialize::sa.__sigaction_handler.sa_handler = anon_unknown_1::handle_signal;
      Initialize::sa.sa_flags = 0x10000000;
      sigfillset((sigset_t *)&Initialize::sa.sa_mask);
      for (piVar3 = local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          piVar3 != local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish; piVar3 = piVar3 + 1) {
        sigaction(*piVar3,(sigaction *)&Initialize::sa,(sigaction *)0x0);
      }
      if (local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (int *)0x0) {
        operator_delete(local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
  }
  return;
}

Assistant:

void Initialize(int& argc, char**& argv, MPI_Comm world_comm) {
  // Avoid repeated initialization.
  if (is_initialized) {
    return;
  }
  internal::mpi::init(argc, argv, world_comm);
  progress_engine = new internal::ProgressEngine();
#ifndef AL_PE_START_ON_DEMAND
  progress_engine->run();
#endif
  is_initialized = true;
#ifdef AL_HAS_CUDA
  internal::cuda::init(argc, argv);
#endif
#ifdef AL_HAS_NCCL
  internal::nccl::init(argc, argv);
#endif
#ifdef AL_HAS_MPI_CUDA
  internal::mpi_cuda::init(argc, argv);
#endif
#ifdef AL_HAS_HOST_TRANSFER
  internal::ht::init(argc, argv);
#endif

#ifdef AL_SIGNAL_HANDLER
  // Set AL_DISABLE_SIGNAL_HANDLER to a non-zero value to disable it.
  if (const char* env = std::getenv("AL_DISABLE_SIGNAL_HANDLER");
      env == nullptr || std::string(env) == "0") {
    // Add signal handlers.
    const std::vector<int> handled_signals = {SIGILL, SIGABRT, SIGFPE,
                                              SIGBUS, SIGSEGV};
    static struct sigaction sa;
    sa.sa_handler = &handle_signal;
    sa.sa_flags = SA_RESTART;
    sigfillset(&sa.sa_mask);
    for (const auto& sig : handled_signals) {
      sigaction(sig, &sa, nullptr);
    }
  }
#endif  // AL_SIGNAL_HANDLER
}